

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

void lj_lex_next(LexState *ls)

{
  int iVar1;
  
  iVar1 = ls->lookahead;
  ls->lastline = ls->linenumber;
  if (iVar1 == 0x121) {
    iVar1 = lex_scan(ls,&ls->tokval);
  }
  else {
    ls->lookahead = 0x121;
    ls->tokval = ls->lookaheadval;
  }
  ls->tok = iVar1;
  return;
}

Assistant:

void lj_lex_next(LexState *ls)
{
  ls->lastline = ls->linenumber;
  if (LJ_LIKELY(ls->lookahead == TK_eof)) {  /* No lookahead token? */
    ls->tok = lex_scan(ls, &ls->tokval);  /* Get next token. */
  } else {  /* Otherwise return lookahead token. */
    ls->tok = ls->lookahead;
    ls->lookahead = TK_eof;
    ls->tokval = ls->lookaheadval;
  }
}